

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshCache.cpp
# Opt level: O0

s32 __thiscall irr::scene::CMeshCache::getMeshIndex(CMeshCache *this,IMesh *mesh)

{
  u32 uVar1;
  int iVar2;
  MeshEntry *pMVar3;
  undefined4 extraout_var;
  IAnimatedMesh *in_RSI;
  u32 i;
  u32 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar4;
  uint local_1c;
  
  local_1c = 0;
  while( true ) {
    uVar4 = local_1c;
    uVar1 = core::array<irr::scene::CMeshCache::MeshEntry>::size
                      ((array<irr::scene::CMeshCache::MeshEntry> *)0x304486);
    if (uVar1 <= uVar4) {
      return -1;
    }
    pMVar3 = core::array<irr::scene::CMeshCache::MeshEntry>::operator[]
                       ((array<irr::scene::CMeshCache::MeshEntry> *)
                        CONCAT44(uVar4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
    if (pMVar3->Mesh == in_RSI) break;
    pMVar3 = core::array<irr::scene::CMeshCache::MeshEntry>::operator[]
                       ((array<irr::scene::CMeshCache::MeshEntry> *)
                        CONCAT44(uVar4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
    if (pMVar3->Mesh != (IAnimatedMesh *)0x0) {
      pMVar3 = core::array<irr::scene::CMeshCache::MeshEntry>::operator[]
                         ((array<irr::scene::CMeshCache::MeshEntry> *)
                          CONCAT44(uVar4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
      iVar2 = (*(pMVar3->Mesh->super_IMesh)._vptr_IMesh[0xd])(pMVar3->Mesh,0,0xff,0xffffffff);
      if ((IAnimatedMesh *)CONCAT44(extraout_var,iVar2) == in_RSI) {
        return local_1c;
      }
    }
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

s32 CMeshCache::getMeshIndex(const IMesh *const mesh) const
{
	for (u32 i = 0; i < Meshes.size(); ++i) {
		if (Meshes[i].Mesh == mesh || (Meshes[i].Mesh && Meshes[i].Mesh->getMesh(0) == mesh))
			return (s32)i;
	}

	return -1;
}